

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cc
# Opt level: O0

bool __thiscall
draco::Metadata::GetEntryBinary
          (Metadata *this,string *name,vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  
  bVar1 = GetEntry<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Metadata *)name,(string *)value,in_RDI);
  return bVar1;
}

Assistant:

bool Metadata::GetEntryBinary(const std::string &name,
                              std::vector<uint8_t> *value) const {
  return GetEntry(name, value);
}